

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

double polymul_internal::polynomial_evaluator<double,_double,_3,_2>::eval_monomial
                 (double *p,double *x)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  
  dVar2 = *x;
  dVar3 = x[1];
  dVar4 = x[2];
  dVar5 = p[2];
  dVar6 = p[1];
  dVar7 = *p;
  iVar12 = binomial(3,1);
  pdVar1 = p + iVar12;
  dVar8 = x[2];
  dVar9 = pdVar1[1];
  dVar10 = x[1];
  dVar11 = *pdVar1;
  iVar12 = binomial(2,1);
  return (dVar7 * dVar2 + dVar3 * dVar6 + dVar4 * dVar5) * dVar2 +
         (dVar11 * dVar10 + dVar8 * dVar9) * dVar10 + x[2] * x[2] * pdVar1[iVar12];
}

Assistant:

static vartype eval_monomial(const numtype p[], const vartype x[]) {
    return x[0] *
               polynomial_evaluator<numtype, vartype, Nvar, Ndeg - 1>::eval_monomial(
                   p, x) +
           polynomial_evaluator<numtype, vartype, Nvar - 1, Ndeg>::eval_monomial(
               p + binomial(Nvar + Ndeg - 2, Ndeg - 1), x + 1);
  }